

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_varg(jit_State *J,BCReg dst,ptrdiff_t nresults)

{
  byte bVar1;
  TValue *pTVar2;
  TRef *pTVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  IRRef1 IVar7;
  TRef TVar8;
  TRef TVar9;
  TRef TVar10;
  ulong uVar11;
  ulong uVar12;
  IRRef1 IVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int32_t iVar20;
  ulong uVar21;
  uint32_t asize;
  ulong uVar22;
  IROpT IVar23;
  uint uVar24;
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  TRef local_5c;
  
  uVar12 = (ulong)dst;
  bVar1 = J->pt->numparams;
  uVar24 = (uint)bVar1;
  asize = ~uVar24 + (*(int *)((long)J->L->base + -4) >> 3);
  uVar21 = (ulong)(int)asize;
  if (J->framedepth < 1) {
    (J->fold).ins.field_0.ot = 0x4513;
    (J->fold).ins.field_1.op12 = 0x120000;
    TVar8 = lj_opt_fold(J);
    uVar17 = uVar24 * 8 + 0xb;
    IVar13 = (IRRef1)TVar8;
    if (nresults < 0) {
      if ((J->pc[1] & 0xffff00ff) == 0x201003d) {
        pTVar2 = J->L->base;
        uVar12 = (ulong)(J->pc[1] >> 8 & 0xff);
        if ((*(int *)((long)pTVar2 + uVar12 * 8 + 4) == -9) &&
           (*(char *)((ulong)pTVar2[uVar12].u32.lo + 6) == '\x11')) {
          uVar16 = dst - 1;
          local_5c = J->base[uVar16];
          iVar20 = lj_ffrecord_select_mode(J,local_5c,J->L->base + uVar16);
          if (-1 < iVar20) {
            if ((iVar20 != 0) && (4 < (local_5c >> 0x18 & 0x1f) - 0xf)) {
              (J->fold).ins.field_0.op1 = (IRRef1)local_5c;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5593226e;
              local_5c = lj_opt_fold(J);
            }
            if ((short)(IRRef1)local_5c < 0 || iVar20 == 0) {
              if ((int)asize < iVar20) {
                TVar8 = lj_ir_kint(J,uVar17);
                IVar7 = (IRRef1)TVar8;
                if (iVar20 == 0) {
                  TVar8 = lj_ir_kint(J,0);
                }
                else {
                  TVar8 = lj_ir_kint(J,3);
                  (J->fold).ins.field_0.ot = 0x2313;
                  (J->fold).ins.field_0.op1 = (IRRef1)local_5c;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
                  TVar8 = lj_opt_fold(J);
                  (J->fold).ins.field_0.ot = 0x2813;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
                  (J->fold).ins.field_0.op2 = IVar7;
                  TVar8 = lj_opt_fold(J);
                  IVar7 = (IRRef1)TVar8;
                  TVar8 = 0x7fff;
                }
                (J->fold).ins.field_0.ot = 0x93;
                (J->fold).ins.field_0.op1 = IVar13;
                (J->fold).ins.field_0.op2 = IVar7;
                lj_opt_fold(J);
              }
              else {
                TVar8 = lj_ir_kint(J,uVar24 * -8 + -0xb);
                (J->fold).ins.field_0.ot = 0x2813;
                (J->fold).ins.field_0.op1 = IVar13;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
                TVar8 = lj_opt_fold(J);
                if (bVar1 != 0) {
                  TVar9 = lj_ir_kint(J,0);
                  (J->fold).ins.field_0.ot = 0x193;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                  lj_opt_fold(J);
                }
                TVar9 = lj_ir_kint(J,3);
                (J->fold).ins.field_0.ot = 0x2413;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                TVar8 = lj_opt_fold(J);
                if (iVar20 != 0) {
                  TVar9 = lj_ir_kint(J,-1);
                  (J->fold).ins.field_0.ot = 0x2813;
                  (J->fold).ins.field_0.op1 = (IRRef1)local_5c;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                  local_5c = lj_opt_fold(J);
                  rec_idx_abc(J,TVar8,local_5c,asize);
                }
              }
            }
            else {
              TVar8 = lj_ir_kint(J,uVar17 + iVar20 * 8);
              (J->fold).ins.field_0.ot = (ushort)(iVar20 <= (int)asize) << 8 | 0x93;
              (J->fold).ins.field_0.op1 = IVar13;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
              lj_opt_fold(J);
              uVar17 = uVar24 * 8 | 3;
              TVar8 = 0x7fff;
            }
            if ((iVar20 != 0) && (iVar20 <= (int)asize)) {
              (J->fold).ins.field_0.ot = 0x2913;
              (J->fold).ins.field_0.op1 = 0x8000;
              (J->fold).ins.field_0.op2 = IVar13;
              TVar8 = lj_opt_fold(J);
              TVar9 = lj_ir_kint(J,uVar17 - 8);
              (J->fold).ins.field_0.ot = 0x2805;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
              TVar8 = lj_opt_fold(J);
              uVar24 = *(uint *)((long)J->L->base + ((long)(iVar20 + -2) - uVar21) * 8 + 4);
              uVar17 = 3;
              if ((uVar24 & 0xffff8000) != 0xffff0000) {
                uVar17 = ~uVar24;
              }
              uVar18 = 0xe;
              if (0xfffefffe < uVar24) {
                uVar18 = uVar17;
              }
              (J->fold).ins.field_0.ot = 0x3805;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
              (J->fold).ins.field_0.op2 = (IRRef1)local_5c;
              TVar8 = lj_opt_fold(J);
              (J->fold).ins.field_0.ot = (ushort)uVar18 | 0x4680;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
              (J->fold).ins.field_0.op2 = 0;
              TVar9 = lj_opt_fold(J);
              TVar8 = uVar18 * 0xffffff + 0x7fff;
              if (2 < uVar18) {
                TVar8 = TVar9;
              }
            }
            J->base[dst - 2] = TVar8;
            J->maxslot = uVar16;
            J->bcskip = '\x02';
            if (-1 < iVar20) {
              return;
            }
          }
        }
      }
      (J->errinfo).u64 = 0x4050c00000000000;
      lj_trace_err_info(J,LJ_TRERR_NYIBC);
    }
    if ((int)asize < 1) {
      TVar8 = lj_ir_kint(J,uVar17);
      (J->fold).ins.field_0.ot = 0x293;
      (J->fold).ins.field_0.op1 = IVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      lj_opt_fold(J);
      uVar21 = 0;
    }
    else {
      if ((long)uVar21 < nresults) {
        iVar20 = *(int32_t *)((long)J->L->base + -4);
        IVar23 = 0x893;
        uVar22 = uVar21;
      }
      else {
        iVar20 = uVar17 + (int)nresults * 8;
        IVar23 = 0x193;
        uVar22 = nresults;
      }
      TVar8 = lj_ir_kint(J,iVar20);
      (J->fold).ins.field_0.ot = IVar23;
      (J->fold).ins.field_0.op1 = IVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = IVar13;
      TVar8 = lj_opt_fold(J);
      TVar9 = lj_ir_kint(J,uVar24 * 8 | 3);
      (J->fold).ins.field_0.ot = 0x2805;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      TVar8 = lj_opt_fold(J);
      if (nresults != 0) {
        uVar11 = 1;
        if (1 < (long)uVar22) {
          uVar11 = uVar22;
        }
        uVar22 = 0;
        do {
          uVar24 = *(uint *)((long)J->L->base + uVar22 * 8 + (uVar21 * 8 ^ 0xfffffffffffffffc));
          uVar17 = ~uVar24;
          if ((uVar24 & 0xffff8000) == 0xffff0000) {
            uVar17 = 3;
          }
          if (uVar24 < 0xfffeffff) {
            uVar17 = 0xe;
          }
          TVar9 = lj_ir_kint(J,(int32_t)uVar22);
          (J->fold).ins.field_0.ot = 0x3805;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          TVar9 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)uVar17 | 0x4680;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = 0;
          TVar10 = lj_opt_fold(J);
          TVar9 = uVar17 * 0xffffff + 0x7fff;
          if (2 < uVar17) {
            TVar9 = TVar10;
          }
          J->base[uVar12 + uVar22] = TVar9;
          uVar22 = uVar22 + 1;
        } while (uVar11 != uVar22);
      }
    }
    auVar6 = _DAT_00157190;
    auVar5 = _DAT_00157180;
    auVar4 = _DAT_00157170;
    lVar14 = nresults - uVar21;
    if (lVar14 != 0 && (long)uVar21 <= nresults) {
      pTVar3 = J->base;
      lVar15 = lVar14 + -1;
      auVar25._8_4_ = (int)lVar15;
      auVar25._0_8_ = lVar15;
      auVar25._12_4_ = (int)((ulong)lVar15 >> 0x20);
      uVar22 = 0;
      auVar25 = auVar25 ^ _DAT_00157190;
      do {
        auVar27._8_4_ = (int)uVar22;
        auVar27._0_8_ = uVar22;
        auVar27._12_4_ = (int)(uVar22 >> 0x20);
        auVar28 = (auVar27 | auVar5) ^ auVar6;
        iVar26 = auVar25._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar26 && auVar25._0_4_ < auVar28._0_4_ ||
                    iVar26 < auVar28._4_4_) & 1)) {
          pTVar3[uVar21 + uVar12 + uVar22] = 0x7fff;
        }
        if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
            auVar28._12_4_ <= auVar25._12_4_) {
          pTVar3[uVar21 + uVar12 + uVar22 + 1] = 0x7fff;
        }
        auVar27 = (auVar27 | auVar4) ^ auVar6;
        iVar29 = auVar27._4_4_;
        if (iVar29 <= iVar26 && (iVar29 != iVar26 || auVar27._0_4_ <= auVar25._0_4_)) {
          pTVar3[uVar21 + uVar12 + uVar22 + 2] = 0x7fff;
          pTVar3[uVar21 + uVar12 + uVar22 + 3] = 0x7fff;
        }
        uVar22 = uVar22 + 4;
      } while ((lVar14 + 3U & 0xfffffffffffffffc) != uVar22);
    }
    uVar24 = (int)nresults + dst;
    if (J->maxslot < uVar24) {
      J->maxslot = uVar24;
    }
  }
  else {
    uVar22 = 0;
    if (0 < (long)uVar21) {
      uVar22 = uVar21;
    }
    uVar11 = uVar22;
    if ((nresults == -1) || (uVar11 = nresults, (long)(ulong)J->maxslot < (long)(uVar12 + nresults))
       ) {
      J->maxslot = (int)uVar11 + dst;
    }
    if (0 < (long)uVar11) {
      uVar19 = 0;
      do {
        TVar8 = 0x7fff;
        if (((long)uVar19 < (long)uVar21) && (TVar8 = J->base[~uVar22 + uVar19], TVar8 == 0)) {
          TVar8 = sload(J,(-1 - (int)uVar22) + (int)uVar19);
        }
        J->base[uVar12 + uVar19] = TVar8;
        uVar19 = uVar19 + 1;
      } while (uVar11 != uVar19);
    }
  }
  return;
}

Assistant:

static void rec_varg(jit_State *J, BCReg dst, ptrdiff_t nresults)
{
  int32_t numparams = J->pt->numparams;
  ptrdiff_t nvararg = frame_delta(J->L->base-1) - numparams - 1;
  lua_assert(frame_isvarg(J->L->base-1));
  if (J->framedepth > 0) {  /* Simple case: varargs defined on-trace. */
    ptrdiff_t i;
    if (nvararg < 0) nvararg = 0;
    if (nresults == -1) {
      nresults = nvararg;
      J->maxslot = dst + (BCReg)nvararg;
    } else if (dst + nresults > J->maxslot) {
      J->maxslot = dst + (BCReg)nresults;
    }
    for (i = 0; i < nresults; i++)
      J->base[dst+i] = i < nvararg ? getslot(J, i - nvararg - 1) : TREF_NIL;
  } else {  /* Unknown number of varargs passed to trace. */
    TRef fr = emitir(IRTI(IR_SLOAD), 0, IRSLOAD_READONLY|IRSLOAD_FRAME);
    int32_t frofs = 8*(1+numparams)+FRAME_VARG;
    if (nresults >= 0) {  /* Known fixed number of results. */
      ptrdiff_t i;
      if (nvararg > 0) {
	ptrdiff_t nload = nvararg >= nresults ? nresults : nvararg;
	TRef vbase;
	if (nvararg >= nresults)
	  emitir(IRTGI(IR_GE), fr, lj_ir_kint(J, frofs+8*(int32_t)nresults));
	else
	  emitir(IRTGI(IR_EQ), fr, lj_ir_kint(J, frame_ftsz(J->L->base-1)));
	vbase = emitir(IRTI(IR_SUB), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_P32), vbase, lj_ir_kint(J, frofs-8));
	for (i = 0; i < nload; i++) {
	  IRType t = itype2irt(&J->L->base[i-1-nvararg]);
	  TRef aref = emitir(IRT(IR_AREF, IRT_P32),
			     vbase, lj_ir_kint(J, (int32_t)i));
	  TRef tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	  if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
	  J->base[dst+i] = tr;
	}
      } else {
	emitir(IRTGI(IR_LE), fr, lj_ir_kint(J, frofs));
	nvararg = 0;
      }
      for (i = nvararg; i < nresults; i++)
	J->base[dst+i] = TREF_NIL;
      if (dst + (BCReg)nresults > J->maxslot)
	J->maxslot = dst + (BCReg)nresults;
    } else if (select_detect(J)) {  /* y = select(x, ...) */
      TRef tridx = J->base[dst-1];
      TRef tr = TREF_NIL;
      ptrdiff_t idx = lj_ffrecord_select_mode(J, tridx, &J->L->base[dst-1]);
      if (idx < 0) goto nyivarg;
      if (idx != 0 && !tref_isinteger(tridx))
	tridx = emitir(IRTGI(IR_CONV), tridx, IRCONV_INT_NUM|IRCONV_INDEX);
      if (idx != 0 && tref_isk(tridx)) {
	emitir(IRTGI(idx <= nvararg ? IR_GE : IR_LT),
	       fr, lj_ir_kint(J, frofs+8*(int32_t)idx));
	frofs -= 8;  /* Bias for 1-based index. */
      } else if (idx <= nvararg) {  /* Compute size. */
	TRef tmp = emitir(IRTI(IR_ADD), fr, lj_ir_kint(J, -frofs));
	if (numparams)
	  emitir(IRTGI(IR_GE), tmp, lj_ir_kint(J, 0));
	tr = emitir(IRTI(IR_BSHR), tmp, lj_ir_kint(J, 3));
	if (idx != 0) {
	  tridx = emitir(IRTI(IR_ADD), tridx, lj_ir_kint(J, -1));
	  rec_idx_abc(J, tr, tridx, (uint32_t)nvararg);
	}
      } else {
	TRef tmp = lj_ir_kint(J, frofs);
	if (idx != 0) {
	  TRef tmp2 = emitir(IRTI(IR_BSHL), tridx, lj_ir_kint(J, 3));
	  tmp = emitir(IRTI(IR_ADD), tmp2, tmp);
	} else {
	  tr = lj_ir_kint(J, 0);
	}
	emitir(IRTGI(IR_LT), fr, tmp);
      }
      if (idx != 0 && idx <= nvararg) {
	IRType t;
	TRef aref, vbase = emitir(IRTI(IR_SUB), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_P32), vbase, lj_ir_kint(J, frofs-8));
	t = itype2irt(&J->L->base[idx-2-nvararg]);
	aref = emitir(IRT(IR_AREF, IRT_P32), vbase, tridx);
	tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
      }
      J->base[dst-2] = tr;
      J->maxslot = dst-1;
      J->bcskip = 2;  /* Skip CALLM + select. */
    } else {
    nyivarg:
      setintV(&J->errinfo, BC_VARG);
      lj_trace_err_info(J, LJ_TRERR_NYIBC);
    }
  }
}